

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DnsStats.cpp
# Opt level: O0

void __thiscall
DnsStats::SubmitCborRecords
          (DnsStats *this,cdns *cdns_ctx,cdns_query *query,cdns_query_signature *q_sig,
          cdns_qr_extended *ext,bool is_response)

{
  int iVar1;
  uint8_t *puVar2;
  size_t sVar3;
  uint8_t *puVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  size_type sVar8;
  size_type sVar9;
  reference pvVar10;
  reference pvVar11;
  reference this_00;
  cdns_rr_field *pcVar12;
  cdns_query *this_01;
  reference pvVar13;
  reference pvVar14;
  size_type sVar15;
  uint32_t *local_160;
  uint32_t *local_150;
  uint32_t local_fc;
  size_t rname_id;
  size_t cid_2;
  size_t nid_2;
  size_t opt_rrid;
  uint local_c8;
  int edns_flags;
  int ttl;
  int rr_class;
  size_t nid_1;
  size_t rrid;
  size_t cid_1;
  cdns_rr_field *rr;
  size_t j;
  cdns_rr_list *list;
  int i;
  size_t nid;
  size_t cid;
  int x_i [4];
  int local_5c;
  uint32_t local_58;
  int first_rname_index;
  uint32_t e_length;
  uint32_t e_rcode;
  uint32_t rcode;
  bool is_response_local;
  cdns_qr_extended *ext_local;
  cdns_query_signature *q_sig_local;
  cdns_query *query_local;
  cdns *cdns_ctx_local;
  DnsStats *this_local;
  
  cdns_ctx_local = (cdns *)this;
  query_local = (cdns_query *)cdns_ctx;
  q_sig_local = (cdns_query_signature *)query;
  ext_local = (cdns_qr_extended *)q_sig;
  _rcode = ext;
  e_rcode._3_1_ = is_response;
  if (is_response) {
    local_fc = q_sig->response_rcode;
  }
  else {
    local_fc = q_sig->query_rcode;
  }
  e_length = local_fc;
  first_rname_index = 0;
  local_58 = 0x200;
  local_5c = -1;
  if ((ext->is_filled & 1U) != 0) {
    x_i[0] = ext->authority_index;
    x_i[1] = ext->additional_index;
    if (-1 < ext->question_index) {
      sVar8 = (long)q_sig->query_classtype_index - (long)cdns_ctx->index_offset;
      sVar9 = (long)query->query_name_index - (long)cdns_ctx->index_offset;
      pvVar10 = std::vector<cdns_class_id,_std::allocator<cdns_class_id>_>::operator[]
                          (&(cdns_ctx->block).tables.class_ids,sVar8);
      iVar6 = pvVar10->rr_type;
      pvVar10 = std::vector<cdns_class_id,_std::allocator<cdns_class_id>_>::operator[]
                          ((vector<cdns_class_id,_std::allocator<cdns_class_id>_> *)
                           &query_local[3].q_extended.answer_index,sVar8);
      iVar1 = pvVar10->rr_class;
      pvVar11 = std::vector<cbor_bytes,_std::allocator<cbor_bytes>_>::operator[]
                          ((vector<cbor_bytes,_std::allocator<cbor_bytes>_> *)
                           &query_local[3].r_extended.authority_index,sVar9);
      puVar2 = pvVar11->v;
      pvVar11 = std::vector<cbor_bytes,_std::allocator<cbor_bytes>_>::operator[]
                          ((vector<cbor_bytes,_std::allocator<cbor_bytes>_> *)
                           &query_local[3].r_extended.authority_index,sVar9);
      SubmitQueryContent(this,iVar6,iVar1,puVar2,(uint32_t)pvVar11->l,0);
    }
    for (list._4_4_ = 1; list._4_4_ < 4; list._4_4_ = list._4_4_ + 1) {
      if (-1 < x_i[(long)list._4_4_ + -2]) {
        this_00 = std::vector<cdns_rr_list,_std::allocator<cdns_rr_list>_>::operator[]
                            ((vector<cdns_rr_list,_std::allocator<cdns_rr_list>_> *)
                             &query_local[4].r_extended,
                             (long)x_i[(long)list._4_4_ + -2] -
                             (long)*(int *)&query_local[6].current_block);
        for (rr = (cdns_rr_field *)0x0;
            pcVar12 = (cdns_rr_field *)
                      std::vector<int,_std::allocator<int>_>::size(&this_00->rr_index), rr < pcVar12
            ; rr = (cdns_rr_field *)((long)&rr->name_index + 1)) {
          this_01 = query_local + 5;
          pvVar13 = std::vector<int,_std::allocator<int>_>::operator[]
                              (&this_00->rr_index,(size_type)rr);
          pvVar14 = std::vector<cdns_rr_field,_std::allocator<cdns_rr_field>_>::operator[]
                              ((vector<cdns_rr_field,_std::allocator<cdns_rr_field>_> *)this_01,
                               (long)*pvVar13 - (long)*(int *)&query_local[6].current_block);
          sVar8 = (long)pvVar14->classtype_index - (long)*(int *)&query_local[6].current_block;
          sVar9 = (long)pvVar14->rdata_index - (long)*(int *)&query_local[6].current_block;
          sVar15 = (long)pvVar14->name_index - (long)*(int *)&query_local[6].current_block;
          pvVar10 = std::vector<cdns_class_id,_std::allocator<cdns_class_id>_>::operator[]
                              ((vector<cdns_class_id,_std::allocator<cdns_class_id>_> *)
                               &query_local[3].q_extended.answer_index,sVar8);
          edns_flags = pvVar10->rr_class;
          local_c8 = pvVar14->ttl;
          pvVar10 = std::vector<cdns_class_id,_std::allocator<cdns_class_id>_>::operator[]
                              ((vector<cdns_class_id,_std::allocator<cdns_class_id>_> *)
                               &query_local[3].q_extended.answer_index,sVar8);
          if (pvVar10->rr_type == 0x29) {
            edns_flags = ext_local[3].answer_index;
            local_c8 = cdns::get_edns_flags(ext_local[1].additional_index);
            if (this->dnssec_packet != (uint8_t *)0x0) {
              local_c8 = local_c8 | 0x8000;
            }
          }
          pvVar10 = std::vector<cdns_class_id,_std::allocator<cdns_class_id>_>::operator[]
                              ((vector<cdns_class_id,_std::allocator<cdns_class_id>_> *)
                               &query_local[3].q_extended.answer_index,sVar8);
          iVar6 = pvVar10->rr_type;
          pvVar11 = std::vector<cbor_bytes,_std::allocator<cbor_bytes>_>::operator[]
                              ((vector<cbor_bytes,_std::allocator<cbor_bytes>_> *)
                               &query_local[3].r_extended.authority_index,sVar9);
          sVar3 = pvVar11->l;
          pvVar11 = std::vector<cbor_bytes,_std::allocator<cbor_bytes>_>::operator[]
                              ((vector<cbor_bytes,_std::allocator<cbor_bytes>_> *)
                               &query_local[3].r_extended.authority_index,sVar9);
          puVar2 = pvVar11->v;
          pvVar11 = std::vector<cbor_bytes,_std::allocator<cbor_bytes>_>::operator[]
                              ((vector<cbor_bytes,_std::allocator<cbor_bytes>_> *)
                               &query_local[3].r_extended.authority_index,sVar15);
          puVar4 = pvVar11->v;
          pvVar11 = std::vector<cbor_bytes,_std::allocator<cbor_bytes>_>::operator[]
                              ((vector<cbor_bytes,_std::allocator<cbor_bytes>_> *)
                               &query_local[3].r_extended.authority_index,sVar15);
          if (list._4_4_ == 3) {
            local_150 = (uint32_t *)&first_rname_index;
            local_160 = &local_58;
          }
          else {
            local_150 = (uint32_t *)0x0;
            local_160 = (uint32_t *)0x0;
          }
          SubmitRecordContent(this,iVar6,edns_flags,local_c8,(int)sVar3,puVar2,puVar4,
                              (uint32_t)pvVar11->l,0,local_150,local_160,(bool)(e_rcode._3_1_ & 1));
          if ((local_5c < 0) && (list._4_4_ < 3)) {
            local_5c = pvVar14->name_index;
          }
        }
      }
    }
  }
  if (((e_rcode._3_1_ & 1) == 0) &&
     (iVar6 = cdns::get_edns_flags(ext_local[1].additional_index), -1 < ext_local[3].authority_index
     )) {
    sVar8 = (long)ext_local[3].authority_index - (long)*(int *)&query_local[6].current_block;
    iVar1 = ext_local[3].answer_index;
    pvVar11 = std::vector<cbor_bytes,_std::allocator<cbor_bytes>_>::operator[]
                        ((vector<cbor_bytes,_std::allocator<cbor_bytes>_> *)
                         &query_local[3].r_extended.authority_index,sVar8);
    sVar3 = pvVar11->l;
    pvVar11 = std::vector<cbor_bytes,_std::allocator<cbor_bytes>_>::operator[]
                        ((vector<cbor_bytes,_std::allocator<cbor_bytes>_> *)
                         &query_local[3].r_extended.authority_index,sVar8);
    SubmitRecordContent(this,0x29,iVar1,iVar6,(int)sVar3,pvVar11->v,(uint8_t *)0x0,0,0,
                        (uint32_t *)&first_rname_index,&local_58,(bool)(e_rcode._3_1_ & 1));
  }
  e_length = first_rname_index << 4 | e_length;
  SubmitRegistryNumber(this,4,e_length);
  if ((this->dnsstat_flags & 0x10) != 0) {
    if ((e_rcode._3_1_ & 1) == 0) {
      SubmitRegistryNumber(this,0x13,q_sig_local->query_classtype_index);
      SubmitRegistryNumber(this,0x12,local_58);
    }
    else {
      SubmitRegistryNumber(this,0x14,q_sig_local->query_qd_count);
      uVar7 = cdns::get_dns_flags(ext_local[1].additional_index,true);
      if ((uVar7 & 0x20) != 0) {
        SubmitRegistryNumber(this,0x15,local_58);
      }
    }
  }
  if ((e_rcode._3_1_ & 1) != 0) {
    sVar8 = (long)q_sig_local->query_rcode - (long)*(int *)&query_local[6].current_block;
    if (local_5c < 0) {
      this->is_qname_minimized = true;
    }
    else {
      pvVar11 = std::vector<cbor_bytes,_std::allocator<cbor_bytes>_>::operator[]
                          ((vector<cbor_bytes,_std::allocator<cbor_bytes>_> *)
                           &query_local[3].r_extended.authority_index,sVar8);
      if (pvVar11->l == 0) {
        this->is_qname_minimized = true;
      }
      else {
        sVar9 = (long)ext_local[2].question_index - (long)*(int *)&query_local[6].current_block;
        sVar15 = (long)local_5c - (long)*(int *)&query_local[6].current_block;
        pvVar10 = std::vector<cdns_class_id,_std::allocator<cdns_class_id>_>::operator[]
                            ((vector<cdns_class_id,_std::allocator<cdns_class_id>_> *)
                             &query_local[3].q_extended.answer_index,sVar9);
        iVar6 = pvVar10->rr_class;
        pvVar10 = std::vector<cdns_class_id,_std::allocator<cdns_class_id>_>::operator[]
                            ((vector<cdns_class_id,_std::allocator<cdns_class_id>_> *)
                             &query_local[3].q_extended.answer_index,sVar9);
        iVar1 = pvVar10->rr_type;
        pvVar11 = std::vector<cbor_bytes,_std::allocator<cbor_bytes>_>::operator[]
                            ((vector<cbor_bytes,_std::allocator<cbor_bytes>_> *)
                             &query_local[3].r_extended.authority_index,sVar8);
        puVar2 = pvVar11->v;
        pvVar11 = std::vector<cbor_bytes,_std::allocator<cbor_bytes>_>::operator[]
                            ((vector<cbor_bytes,_std::allocator<cbor_bytes>_> *)
                             &query_local[3].r_extended.authority_index,sVar8);
        sVar3 = pvVar11->l;
        pvVar11 = std::vector<cbor_bytes,_std::allocator<cbor_bytes>_>::operator[]
                            ((vector<cbor_bytes,_std::allocator<cbor_bytes>_> *)
                             &query_local[3].r_extended.authority_index,sVar15);
        puVar4 = pvVar11->v;
        pvVar11 = std::vector<cbor_bytes,_std::allocator<cbor_bytes>_>::operator[]
                            ((vector<cbor_bytes,_std::allocator<cbor_bytes>_> *)
                             &query_local[3].r_extended.authority_index,sVar15);
        bVar5 = IsQNameMinimized(1,iVar6,iVar1,puVar2,(uint32_t)sVar3,0,puVar4,(uint32_t)pvVar11->l,
                                 0);
        this->is_qname_minimized = bVar5;
      }
    }
  }
  return;
}

Assistant:

void DnsStats::SubmitCborRecords(cdns* cdns_ctx, cdns_query* query, cdns_query_signature* q_sig,
    cdns_qr_extended * ext, bool is_response)
{
    uint32_t rcode = (is_response) ? q_sig->response_rcode : q_sig->query_rcode;
    uint32_t e_rcode = 0;
    uint32_t e_length = 512;
    int first_rname_index = -1;


    if (ext->is_filled) {
        int x_i[4] = { ext->question_index, ext->answer_index, ext->authority_index, ext->additional_index };

        if (x_i[0] >= 0) {
            /* assume just one query per q_sig, but sometimes there is none. */
            size_t cid = (size_t)q_sig->query_classtype_index - cdns_ctx->index_offset;
            size_t nid = (size_t)query->query_name_index - cdns_ctx->index_offset;
            SubmitQueryContent(cdns_ctx->block.tables.class_ids[cid].rr_type,
                cdns_ctx->block.tables.class_ids[cid].rr_class,
                cdns_ctx->block.tables.name_rdata[nid].v,
                (uint32_t)cdns_ctx->block.tables.name_rdata[nid].l, 0);
        }

        for (int i = 1; i < 4; i++) {
            if (x_i[i] >= 0) {
                cdns_rr_list* list = &cdns_ctx->block.tables.rr_list[(size_t)x_i[i]- cdns_ctx->index_offset];

                for (size_t j = 0; j < list->rr_index.size(); j++) {
                    cdns_rr_field * rr = &cdns_ctx->block.tables.rrs[(size_t)list->rr_index[j]- cdns_ctx->index_offset];
                    size_t cid = (size_t)rr->classtype_index - cdns_ctx->index_offset;
                    size_t rrid = (size_t) rr->rdata_index - cdns_ctx->index_offset;
                    size_t nid = (size_t)rr->name_index - cdns_ctx->index_offset;
                    int rr_class = cdns_ctx->block.tables.class_ids[cid].rr_class;
                    int ttl = rr->ttl;

                    if (cdns_ctx->block.tables.class_ids[cid].rr_type == DnsRtype_OPT) {
                        rr_class = q_sig->udp_buf_size;
                        ttl = cdns::get_edns_flags(q_sig->qr_dns_flags);

                        if (dnssec_packet != NULL) {
                            ttl |= (1 << 15);
                        }
                    }

                    SubmitRecordContent(
                        cdns_ctx->block.tables.class_ids[cid].rr_type, rr_class, ttl,
                        (uint32_t)cdns_ctx->block.tables.name_rdata[rrid].l,
                        cdns_ctx->block.tables.name_rdata[rrid].v,
                        cdns_ctx->block.tables.name_rdata[nid].v,
                        (uint32_t)cdns_ctx->block.tables.name_rdata[nid].l,
                        0, (i == 3) ? &e_rcode : NULL, (i == 3) ? &e_length : NULL, is_response);
                    if (first_rname_index < 0 && i < 3) {
                        first_rname_index = rr->name_index;
                    }
                }
            }
        }
    }

    if (!is_response) {
        int edns_flags = cdns::get_edns_flags(q_sig->qr_dns_flags);
        if (q_sig->opt_rdata_index >= 0) {
            size_t opt_rrid = (size_t)q_sig->opt_rdata_index - cdns_ctx->index_offset;

            SubmitRecordContent(DnsRtype_OPT, q_sig->udp_buf_size, edns_flags,
                (uint32_t)cdns_ctx->block.tables.name_rdata[opt_rrid].l,
                cdns_ctx->block.tables.name_rdata[opt_rrid].v,
                NULL, 0, 0, &e_rcode, &e_length, is_response);
        }
    }

    
    rcode |= (e_rcode << 4);
    SubmitRegistryNumber(REGISTRY_DNS_RCODES, rcode);

    if ((dnsstat_flags & dnsStateFlagCountPacketSizes) != 0)
    {
        if (is_response)
        {
            SubmitRegistryNumber(REGISTRY_DNS_Response_Size, query->response_size);
            if ((cdns::get_dns_flags(q_sig->qr_dns_flags,true) & (1 << 5)) != 0)
            {
                SubmitRegistryNumber(REGISTRY_DNS_TC_length, e_length);
            }
        }
        else
        {
            SubmitRegistryNumber(REGISTRY_DNS_Query_Size, query->query_size);
            SubmitRegistryNumber(REGISTRY_EDNS_Packet_Size, e_length);
        }
    }

    if (is_response) {
        size_t nid = (size_t)query->query_name_index - cdns_ctx->index_offset;
        if (first_rname_index >= 0) {
            if (cdns_ctx->block.tables.name_rdata[nid].l == 0) {
                is_qname_minimized = true;
            }
            else {
                size_t cid = (size_t)q_sig->query_classtype_index - cdns_ctx->index_offset;
                size_t rname_id = (size_t)first_rname_index - cdns_ctx->index_offset;

                is_qname_minimized = IsQNameMinimized(
                    1,
                    cdns_ctx->block.tables.class_ids[cid].rr_class,
                    cdns_ctx->block.tables.class_ids[cid].rr_type,
                    cdns_ctx->block.tables.name_rdata[nid].v,
                    (uint32_t)cdns_ctx->block.tables.name_rdata[nid].l, 0,
                    cdns_ctx->block.tables.name_rdata[rname_id].v,
                    (uint32_t)cdns_ctx->block.tables.name_rdata[rname_id].l, 0);
            }
        }
        else {
            /* In the absence of further knowledge, assume that this is true. */
            is_qname_minimized = true;
        }
    }
}